

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O2

void custom_background(bool status,int color)

{
  undefined7 in_register_00000039;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string local_28;
  
  if ((int)CONCAT71(in_register_00000039,status) != 0) {
    std::__cxx11::to_string(&local_28,color);
    std::operator+(&bStack_68,"\x1b[48;5;",&local_28);
    std::operator+(&local_48,&bStack_68,"m");
    std::operator<<((ostream *)&std::cout,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&bStack_68);
    std::__cxx11::string::~string((string *)&local_28);
    return;
  }
  std::operator<<((ostream *)&std::cout,"\x1b[48;5;0m");
  return;
}

Assistant:

void custom_background(bool status,int color){
	if (status == true) cout<<"\033[48;5;"+to_string(color)+"m";
	else cout<<"\033[48;5;0m";
}